

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleLeggedOdometry.cpp
# Opt level: O2

int __thiscall iDynTree::SimpleLeggedOdometry::init(SimpleLeggedOdometry *this,EVP_PKEY_CTX *ctx)

{
  char cVar1;
  LinkIndex LVar2;
  long lVar3;
  Transform *pTVar4;
  undefined8 uVar5;
  char *pcVar6;
  Transform linkAttachedToWorld_H_floatingBase;
  Transform floatingBase_H_fixedLink;
  Transform initalReferenceFrame_H_linkAttachedToWorld;
  Transform world_H_initialReferenceFrame;
  undefined1 local_2d0 [96];
  Transform local_270 [96];
  Transform local_210 [96];
  Transform local_1b0 [96];
  Transform local_150 [192];
  Transform local_90 [96];
  
  if (this->m_isModelValid == false) {
    pcVar6 = "Model not initialised.";
  }
  else {
    cVar1 = iDynTree::Model::isValidFrameIndex((long)this);
    if ((cVar1 == '\0') || (cVar1 = iDynTree::Model::isValidFrameIndex((long)this), cVar1 == '\0'))
    {
      pcVar6 = "invalid frame passed";
    }
    else {
      if (this->m_kinematicsUpdated != false) {
        LVar2 = iDynTree::Model::getFrameLink((long)this);
        this->m_fixedLinkIndex = LVar2;
        lVar3 = iDynTree::Model::getFrameLink((long)this);
        iDynTree::Transform::inverse();
        iDynTree::Model::getFrameTransform((long)local_2d0);
        iDynTree::Transform::inverse();
        iDynTree::LinkPositions::operator()(&this->m_base_H_link,lVar3);
        iDynTree::Transform::inverse();
        pTVar4 = (Transform *)
                 iDynTree::LinkPositions::operator()(&this->m_base_H_link,this->m_fixedLinkIndex);
        iDynTree::Transform::Transform(local_150,pTVar4);
        iDynTree::Transform::operator*(local_270,local_90);
        iDynTree::Transform::operator*(local_210,local_270);
        iDynTree::Transform::operator*(local_1b0,local_210);
        uVar5 = iDynTree::Transform::operator=(&this->m_world_H_fixedLink,local_1b0);
        this->m_isOdometryInitialized = true;
        return (int)CONCAT71((int7)((ulong)uVar5 >> 8),1);
      }
      pcVar6 = "updateKinematics never called";
    }
  }
  iDynTree::reportError("SimpleLeggedOdometry","init",pcVar6);
  return 0;
}

Assistant:

bool SimpleLeggedOdometry::init(const FrameIndex initialFixedFrameIndex,
                                const FrameIndex initalReferenceFrameIndexForWorld,
                                const Transform initialReferenceFrame_H_world)
{
    if( !m_isModelValid )
    {
         reportError("SimpleLeggedOdometry",
                     "init",
                     "Model not initialised.");
         return false;
    }

    if( !m_model.isValidFrameIndex(initialFixedFrameIndex) ||
        !m_model.isValidFrameIndex(initalReferenceFrameIndexForWorld) )
    {
        reportError("SimpleLeggedOdometry",
                    "init","invalid frame passed");
        return false;
    }

    if( ! m_kinematicsUpdated )
    {
        reportError("SimpleLeggedOdometry",
                    "init","updateKinematics never called");
        return false;
    }

    m_fixedLinkIndex = m_model.getFrameLink(initialFixedFrameIndex);
    LinkIndex linkAttachedToWorldIndex = m_model.getFrameLink(initalReferenceFrameIndexForWorld);

    Transform world_H_initialReferenceFrame = initialReferenceFrame_H_world.inverse();
    Transform initalReferenceFrame_H_linkAttachedToWorld =  m_model.getFrameTransform(initalReferenceFrameIndexForWorld).inverse();
    Transform linkAttachedToWorld_H_floatingBase = m_base_H_link(linkAttachedToWorldIndex).inverse();
    Transform floatingBase_H_fixedLink           = m_base_H_link(m_fixedLinkIndex);

    m_world_H_fixedLink = world_H_initialReferenceFrame*initalReferenceFrame_H_linkAttachedToWorld*linkAttachedToWorld_H_floatingBase*floatingBase_H_fixedLink;

    m_isOdometryInitialized = true;

    return true;
}